

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O1

int __thiscall tinyxml2::XMLElement::IntAttribute(XMLElement *this,char *name)

{
  uint in_EAX;
  XMLAttribute *this_00;
  int i;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  this_00 = FindAttribute(this,name);
  if (this_00 != (XMLAttribute *)0x0) {
    XMLAttribute::QueryIntValue(this_00,(int *)((long)&uStack_8 + 4));
  }
  return uStack_8._4_4_;
}

Assistant:

int		 IntAttribute( const char* name ) const		{
        int i=0;
        QueryIntAttribute( name, &i );
        return i;
    }